

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  CallInfo *pCVar1;
  ulong uVar2;
  int iVar3;
  
  pCVar1 = L->ci;
  if (0 < level) {
    do {
      if (pCVar1 <= L->base_ci) {
        return 0;
      }
      level = level + -1;
      if ((((pCVar1->func->value).gc)->h).flags == '\0') {
        level = level - pCVar1->tailcalls;
      }
      pCVar1 = pCVar1 + -1;
    } while (0 < level);
  }
  iVar3 = 0;
  if (level == 0) {
    uVar2 = (long)pCVar1 - (long)L->base_ci;
    if (pCVar1 < L->base_ci || uVar2 == 0) {
      return 0;
    }
    iVar3 = (int)(uVar2 >> 3) * -0x33333333;
  }
  ar->i_ci = iVar3;
  return 1;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci > L->base_ci; ci--) {
    level--;
    if (f_isLua(ci))  /* Lua function? */
      level -= ci->tailcalls;  /* skip lost tail calls */
  }
  if (level == 0 && ci > L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = cast_int(ci - L->base_ci);
  }
  else if (level < 0) {  /* level is of a lost tail call? */
    status = 1;
    ar->i_ci = 0;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}